

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

deUint32 __thiscall glu::sl::ShaderParser::parseShaderStageList(ShaderParser *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  assumeToken(this,TOKEN_LEFT_BRACE);
  advanceToken(this);
  dVar1 = getShaderStageLiteralFlag(this);
  while( true ) {
    advanceToken(this);
    if (this->m_curToken != TOKEN_COMMA) break;
    advanceToken(this);
    dVar2 = getShaderStageLiteralFlag(this);
    if ((dVar2 & dVar1) != 0) goto LAB_01924a1b;
    dVar1 = dVar1 | dVar2;
  }
  if (this->m_curToken == TOKEN_RIGHT_BRACE) {
    assumeToken(this,TOKEN_RIGHT_BRACE);
    advanceToken(this);
    return dVar1;
  }
  std::operator+(&local_38,"invalid shader stage set token: ",&this->m_curTokenStr);
  parseError(this,&local_38);
LAB_01924a1b:
  std::operator+(&local_38,"stage already set in the shader stage set: ",&this->m_curTokenStr);
  parseError(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

deUint32 ShaderParser::parseShaderStageList (void)
{
	deUint32 mask = 0;

	assumeToken(TOKEN_LEFT_BRACE);

	// don't allow 0-sized lists
	advanceToken();
	mask |= getShaderStageLiteralFlag();
	advanceToken();

	for (;;)
	{
		if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else if (m_curToken == TOKEN_COMMA)
		{
			deUint32 stageFlag;
			advanceToken();

			stageFlag = getShaderStageLiteralFlag();
			if (stageFlag & mask)
				parseError(string("stage already set in the shader stage set: " + m_curTokenStr));

			mask |= stageFlag;
			advanceToken();
		}
		else
			parseError(string("invalid shader stage set token: " + m_curTokenStr));
	}
	advanceToken(TOKEN_RIGHT_BRACE);

	return mask;
}